

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashset.cpp
# Opt level: O1

void lsvm::hashset::copy_into_new_bucket
               (hashset *h,hashbucket **pb,hashbucket **b,uint32_t new_size_indx)

{
  uint uVar1;
  int iVar2;
  hashbucket *ptr;
  hashbucket *phVar3;
  hashbucket *phVar4;
  
  ptr = *b;
  *b = ptr->next;
  uVar1 = (&primes)[(byte)new_size_indx];
  phVar4 = (hashbucket *)memory::allocate((ulong)uVar1 * 0x10 + 0x10);
  phVar4->next = (hashbucket_t *)0x0;
  phVar4->count = 0;
  phVar4->bucket_size_indx = new_size_indx & 0xff;
  memset(phVar4 + 1,0,(ulong)uVar1 * 0x10);
  phVar4->next = *pb;
  *pb = phVar4;
  h->count = h->count - ptr->count;
  balance_partition(pb);
  iVar2 = (&primes)[ptr->bucket_size_indx];
  phVar4 = ptr;
  do {
    phVar3 = phVar4 + 1;
    phVar4 = phVar4 + 1;
    if (*(void **)&phVar3->count != (void *)0x0) {
      insert_into_partition
                (h,(hash)phVar4->next,h->bits & (ushort)phVar4->next,*(void **)&phVar3->count,true);
    }
  } while (phVar4 <= ptr + (iVar2 - 1));
  memory::retain(ptr);
  balance_partition(pb);
  return;
}

Assistant:

inline void copy_into_new_bucket(hashset* h, hashbucket** pb, hashbucket** b, uint32_t new_size_indx){

    // remove current bucket from partition and add new bigger one
    hashbucket* ob = *b;
    *b = (*b)->next;
    add_new_bucket(h,pb,new_size_indx);
    h->count -= ob->count;
    
    // rebalance partition
    balance_partition(pb);

    // insert left-over keys into partition
    entry* he = entries(ob); 
    entry* ehe = get_entry(ob,bucket_size(ob)-1); 
    while(he <= ehe){
        if(he->val != null){
            insert_into_partition(h,he->valhash,hashbit(he->valhash,h->bits),he->val,true);
        }
        ++he;
    }
    
    // remove old bucket
    lsvm::memory::retain(ob);

    // rebalance partition
    balance_partition(pb);
}